

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O0

int LS_Thing_Projectile(line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,
                       int arg4)

{
  bool bVar1;
  TAngle<double> local_30;
  int local_28;
  int local_24;
  int arg2_local;
  int arg1_local;
  int arg0_local;
  bool backSide_local;
  AActor *it_local;
  line_t *ln_local;
  
  local_28 = arg2;
  local_24 = arg1;
  arg2_local = arg0;
  arg1_local._3_1_ = backSide;
  _arg0_local = it;
  it_local = (AActor *)ln;
  TAngle<double>::TAngle(&local_30,(double)arg2 * 1.40625);
  bVar1 = P_Thing_Projectile(arg0,it,arg1,(char *)0x0,&local_30,(double)arg3 / 8.0,
                             (double)arg4 / 8.0,0,(AActor *)0x0,0,0,false);
  return (int)bVar1;
}

Assistant:

FUNC(LS_Thing_Projectile)
// Thing_Projectile (tid, type, angle, speed, vspeed)
{
	return P_Thing_Projectile (arg0, it, arg1, NULL, BYTEANGLE(arg2), SPEED(arg3),
		SPEED(arg4), 0, NULL, 0, 0, false);
}